

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

size_t intersect_accel<true,false,false>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  Vec<float,_3UL> *pVVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  Index IVar5;
  pointer pNVar6;
  size_t sVar7;
  pointer pPVar8;
  bool bVar9;
  ulong uVar10;
  int iVar11;
  Index IVar12;
  long lVar13;
  Index IVar14;
  Index IVar15;
  uint uVar16;
  uint uVar17;
  size_t i;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  uint uVar32;
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  undefined8 local_218;
  float local_210;
  size_t local_208;
  Accel *local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  Vec<float,_3UL> *local_1b8;
  size_t local_1b0;
  float local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  Type local_134 [64];
  uint local_34;
  
  local_1b8 = &ray->dir;
  auVar20 = SUB6416(ZEXT464(0x3f800000),0);
  local_148 = vdivss_avx512f(auVar20,ZEXT416((uint)(ray->dir).values[0]));
  uVar16 = local_148._0_4_;
  local_158 = vdivss_avx512f(auVar20,ZEXT416((uint)(ray->dir).values[1]));
  uVar17 = local_158._0_4_;
  local_168 = vdivss_avx512f(auVar20,ZEXT416((uint)(ray->dir).values[2]));
  uVar32 = local_168._0_4_;
  bVar9 = (uVar16 & 0x7fffffff) < 0x7f800000;
  local_178._4_12_ = local_148._4_12_;
  local_178._0_4_ = (uint)bVar9 * (uVar16 + 2) + !bVar9 * uVar16;
  bVar9 = (uVar17 & 0x7fffffff) < 0x7f800000;
  local_188._4_12_ = local_158._4_12_;
  local_188._0_4_ = (uint)bVar9 * (uVar17 + 2) + !bVar9 * uVar17;
  bVar9 = (uVar32 & 0x7fffffff) < 0x7f800000;
  local_198._4_12_ = local_168._4_12_;
  local_198._0_4_ = (uint)bVar9 * (uVar32 + 2) + !bVar9 * uVar32;
  iVar11 = (int)(ray->dir).values[0] >> 0x1f;
  uVar17 = -((int)(ray->dir).values[2] >> 0x1f);
  uVar16 = -((int)(ray->dir).values[1] >> 0x1f);
  local_134[0] = (((accel->bvh).nodes.
                   super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->index).value;
  local_1e0 = (ulong)(uint)(iVar11 * -4);
  local_34 = 1;
  local_208 = 0xffffffffffffffff;
  local_1d0 = (ulong)((uVar16 + 2) * 4);
  local_1d8 = (ulong)((uVar17 + 4) * 4);
  local_1e8 = (ulong)((-iVar11 ^ 1U) << 2);
  local_1c0 = (ulong)((uVar16 ^ 3) << 2);
  local_1c8 = (ulong)((uVar17 ^ 5) << 2);
  local_200 = accel;
  do {
    pNVar6 = (local_200->bvh).nodes.
             super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fVar29 = (ray->org).values[0];
    fVar28 = (ray->org).values[1];
    fVar30 = (ray->org).values[2];
    fVar2 = ray->tmin;
    fVar3 = ray->tmax;
LAB_001075bf:
    local_34 = local_34 - 1;
    IVar14.value = local_134[local_34];
    while( true ) {
      uVar16 = IVar14.value >> 4;
      if ((IVar14.value & 0xf) != 0) break;
      auVar20 = vmulss_avx512f(local_148,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar16) + local_1e0) -
                                             fVar29)));
      auVar21 = vmulss_avx512f(local_158,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar16) + local_1d0) -
                                             fVar28)));
      auVar22 = vmulss_avx512f(local_168,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar16) + local_1d8) -
                                             fVar30)));
      auVar23 = vmulss_avx512f(local_178,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar16) + local_1e8) -
                                             fVar29)));
      auVar24 = vmulss_avx512f(local_188,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar16) + local_1c0) -
                                             fVar28)));
      auVar25 = vmulss_avx512f(local_198,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + uVar16) + local_1c8) -
                                             fVar30)));
      auVar20 = vmaxss_avx(auVar20,ZEXT416((uint)fVar2));
      auVar20 = vmaxss_avx(auVar21,auVar20);
      auVar20 = vmaxss_avx(auVar22,auVar20);
      auVar21 = vminss_avx(auVar23,ZEXT416((uint)fVar3));
      auVar21 = vminss_avx(auVar24,auVar21);
      auVar22 = vminss_avx(auVar25,auVar21);
      auVar21 = vmulss_avx512f(local_148,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar16 + 1) +
                                                        local_1e0) - fVar29)));
      auVar23 = vmulss_avx512f(local_158,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar16 + 1) +
                                                        local_1d0) - fVar28)));
      auVar24 = vmulss_avx512f(local_168,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar16 + 1) +
                                                        local_1d8) - fVar30)));
      auVar25 = vsubss_avx512f(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar16 + 1) + local_1c8)),
                               ZEXT416((uint)fVar30));
      auVar26 = vmulss_avx512f(local_178,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar16 + 1) +
                                                        local_1e8) - fVar29)));
      auVar27 = vmulss_avx512f(local_188,
                               ZEXT416((uint)(*(float *)((long)(pNVar6 + (ulong)uVar16 + 1) +
                                                        local_1c0) - fVar28)));
      auVar25 = vmulss_avx512f(local_198,auVar25);
      auVar21 = vmaxss_avx(auVar21,ZEXT416((uint)fVar2));
      auVar21 = vmaxss_avx(auVar23,auVar21);
      auVar21 = vmaxss_avx(auVar24,auVar21);
      auVar23 = vminss_avx(auVar26,ZEXT416((uint)fVar3));
      auVar23 = vminss_avx(auVar27,auVar23);
      auVar23 = vminss_avx(auVar25,auVar23);
      fVar31 = auVar21._0_4_;
      if (auVar20._0_4_ <= auVar22._0_4_) {
        IVar14.value = ((Index *)((long)(pNVar6 + uVar16) + 0x18))->value;
        bVar9 = true;
        if (fVar31 <= auVar23._0_4_) {
          uVar18 = (ulong)local_34;
          if (0x3f < uVar18) {
            __assert_fail("!is_full()",
                          "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/stack.h"
                          ,0x15,
                          "void bvh::v2::SmallStack<bvh::v2::Index<32, 4>, 64>::push(const T &) [T = bvh::v2::Index<32, 4>, Capacity = 64]"
                         );
          }
          IVar5.value = ((Index *)((long)(pNVar6 + (ulong)uVar16 + 1) + 0x18))->value;
          IVar12.value = IVar5.value;
          IVar15.value = IVar14.value;
          if (auVar20._0_4_ <= fVar31) {
            IVar12.value = IVar14.value;
            IVar15.value = IVar5.value;
          }
          IVar14.value = IVar12.value;
          local_34 = local_34 + 1;
          local_134[uVar18] = IVar15.value;
        }
      }
      else if (auVar23._0_4_ < fVar31) {
        bVar9 = false;
      }
      else {
        IVar14.value = ((Index *)((long)(pNVar6 + (ulong)uVar16 + 1) + 0x18))->value;
        bVar9 = true;
      }
      if (!bVar9) goto LAB_00107750;
    }
    uVar18 = (ulong)uVar16;
    do {
      sVar7 = (local_200->bvh).prim_ids.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18];
      pPVar8 = (local_200->tris).
               super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar1 = &pPVar8[sVar7].n;
      auVar20 = vinsertps_avx(ZEXT416((uint)((((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values
                                             [0] - (ray->org).values[0])),
                              ZEXT416((uint)((((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values
                                             [1] - (ray->org).values[1])),0x10);
      local_210 = (((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values[2] - (ray->org).values[2];
      uVar4 = vmovlps_avx(auVar20);
      fVar29 = (ray->dir).values[0];
      fVar28 = (ray->dir).values[1];
      fVar30 = (ray->dir).values[2];
      local_218._0_4_ = (float)uVar4;
      local_218._4_4_ = (float)((ulong)uVar4 >> 0x20);
      auVar20 = vfmsub231ss_fma(ZEXT416((uint)(local_218._4_4_ * fVar30)),ZEXT416((uint)fVar28),
                                ZEXT416((uint)local_210));
      auVar21 = vfmsub231ss_fma(ZEXT416((uint)(local_210 * fVar29)),ZEXT416((uint)(float)local_218),
                                ZEXT416((uint)fVar30));
      auVar20 = vinsertps_avx(auVar20,auVar21,0x10);
      auVar21 = vfmsub231ss_fma(ZEXT416((uint)((float)local_218 * fVar28)),ZEXT416((uint)fVar29),
                                ZEXT416((uint)local_218._4_4_));
      local_1f8 = vmovlps_avx(auVar20);
      local_1f0 = auVar21._0_4_;
      local_218 = uVar4;
      local_1b0 = sVar7;
      fVar28 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,pVVar1,pPVar8 + sVar7 + 1,local_1b8);
      fVar29 = 0.0;
      lVar13 = 0;
      do {
        fVar29 = fVar29 + *(float *)((long)&local_1f8 + lVar13) *
                          *(float *)((long)pPVar8[sVar7].e2.values + lVar13);
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0xc);
      fVar30 = 0.0;
      lVar13 = 0;
      do {
        fVar30 = fVar30 + *(float *)((long)&local_1f8 + lVar13) *
                          *(float *)((long)pPVar8[sVar7].e1.values + lVar13);
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0xc);
      fVar28 = 1.0 / fVar28;
      uVar19 = 0;
      if (((-1.1920929e-07 <= fVar28 * fVar29) && (-1.1920929e-07 <= fVar28 * fVar30)) &&
         (-1.1920929e-07 <= (1.0 - fVar28 * fVar29) - fVar28 * fVar30)) {
        fVar29 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,pVVar1,pPVar8 + sVar7 + 1,&local_218);
        fVar29 = fVar29 * fVar28;
        uVar19 = vcmpps_avx512vl(ZEXT416((uint)ray->tmin),ZEXT416((uint)fVar29),2);
        uVar10 = vcmpps_avx512vl(ZEXT416((uint)fVar29),ZEXT416((uint)ray->tmax),2);
        uVar19 = uVar19 & uVar10;
        local_1a8 = (float)((uint)((byte)uVar19 & 1) * (int)fVar29 +
                           (uint)!(bool)((byte)uVar19 & 1) * (int)local_1a8);
      }
      if ((uVar19 & 1) != 0) {
        ray->tmax = local_1a8;
        local_208 = local_1b0;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (IVar14.value & 0xf) + uVar16);
    if (local_34 == 0) {
      return local_208;
    }
  } while( true );
LAB_00107750:
  if (local_34 == 0) {
    return local_208;
  }
  goto LAB_001075bf;
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}